

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

int __thiscall
glslang::TIntermediate::addUsedLocation
          (TIntermediate *this,TQualifier *qualifier,TType *type,bool *typeCollision)

{
  TRange component;
  undefined4 basicType;
  bool bVar1;
  uint uVar2;
  int iVar3;
  TBasicType TVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar6;
  uint local_1c4;
  undefined1 local_19c [8];
  TIoRange range;
  TBasicType basicTy;
  int consumedComponents;
  TRange componentRange;
  TRange locationRange;
  undefined1 local_154 [8];
  TIoRange range2;
  TRange componentRange2;
  TRange locationRange2;
  undefined1 local_114 [8];
  TIoRange range_2;
  TRange componentRange_1;
  TRange locationRange_1;
  TRange range_1;
  int collision;
  TType elementType;
  int size;
  int set;
  bool *typeCollision_local;
  TType *type_local;
  TQualifier *qualifier_local;
  TIntermediate *this_local;
  
  *typeCollision = false;
  bVar1 = TQualifier::isPipeInput(qualifier);
  if (bVar1) {
    elementType.spirvType._4_4_ = 0;
  }
  else {
    bVar1 = TQualifier::isPipeOutput(qualifier);
    if (bVar1) {
      elementType.spirvType._4_4_ = 1;
    }
    else if (((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) == 5) {
      elementType.spirvType._4_4_ = 2;
    }
    else if (((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) == 6) {
      elementType.spirvType._4_4_ = 3;
    }
    else if (((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) == 0x1f) {
      elementType.spirvType._4_4_ = 4;
    }
    else {
      bVar1 = TQualifier::isAnyPayload(qualifier);
      if (bVar1) {
        elementType.spirvType._4_4_ = 0;
      }
      else {
        bVar1 = TQualifier::isAnyCallable(qualifier);
        if (bVar1) {
          elementType.spirvType._4_4_ = 1;
        }
        else {
          bVar1 = TQualifier::isHitObjectAttrNV(qualifier);
          if (!bVar1) {
            return -1;
          }
          elementType.spirvType._4_4_ = 2;
        }
      }
    }
  }
  bVar1 = TQualifier::isAnyPayload(qualifier);
  if ((bVar1) || (bVar1 = TQualifier::isAnyCallable(qualifier), bVar1)) {
    elementType.spirvType._0_4_ = 1;
  }
  else {
    bVar1 = TQualifier::isUniformOrBuffer(qualifier);
    if ((bVar1) || (bVar1 = TQualifier::isTaskMemory(qualifier), bVar1)) {
      uVar2 = (*type->_vptr_TType[0x1e])();
      if ((uVar2 & 1) == 0) {
        elementType.spirvType._0_4_ = 1;
      }
      else {
        elementType.spirvType._0_4_ = (*type->_vptr_TType[0x11])();
      }
    }
    else {
      uVar2 = (*type->_vptr_TType[0x1d])();
      if (((uVar2 & 1) == 0) || (bVar1 = TQualifier::isArrayedIo(qualifier,this->language), !bVar1))
      {
        elementType.spirvType._0_4_ = computeTypeLocationSize(type,this->language);
      }
      else {
        TType::TType((TType *)&range_1.last,type,0,false);
        elementType.spirvType._0_4_ = computeTypeLocationSize((TType *)&range_1.last,this->language)
        ;
        TType::~TType((TType *)&range_1.last);
      }
    }
  }
  range_1.start = -1;
  bVar1 = TQualifier::isAnyPayload(qualifier);
  if (((bVar1) || (bVar1 = TQualifier::isAnyCallable(qualifier), bVar1)) ||
     (bVar1 = TQualifier::isHitObjectAttrNV(qualifier), bVar1)) {
    TRange::TRange(&locationRange_1,(uint)*(undefined8 *)&qualifier->field_0x1c & 0xfff,
                   (uint)*(undefined8 *)&qualifier->field_0x1c & 0xfff);
    range_1.start =
         checkLocationRT(this,elementType.spirvType._4_4_,
                         (uint)*(undefined8 *)&qualifier->field_0x1c & 0xfff);
    if (range_1.start < 0) {
      std::vector<glslang::TRange,_std::allocator<glslang::TRange>_>::push_back
                (this->usedIoRT + elementType.spirvType._4_4_,&locationRange_1);
    }
    this_local._4_4_ = range_1.start;
  }
  else if ((((int)elementType.spirvType == 2) && (iVar3 = (*type->_vptr_TType[7])(), iVar3 == 2)) &&
          ((iVar3 = (*type->_vptr_TType[0xc])(), iVar3 == 3 &&
           ((bVar1 = TQualifier::isPipeInput(qualifier), bVar1 ||
            (bVar1 = TQualifier::isPipeOutput(qualifier), bVar1)))))) {
    TRange::TRange(&componentRange_1,(uint)*(undefined8 *)&qualifier->field_0x1c & 0xfff,
                   (uint)*(undefined8 *)&qualifier->field_0x1c & 0xfff);
    TRange::TRange((TRange *)&range_2.centroid,0,3);
    TVar4 = (*type->_vptr_TType[7])();
    TIoRange::TIoRange((TIoRange *)local_114,componentRange_1,(TRange)range_2._24_8_,TVar4,0,
                       (bool)((byte)(*(ulong *)&qualifier->field_0x8 >> 0x1d) & 1),
                       (bool)((byte)(*(ulong *)&qualifier->field_0x8 >> 0x1e) & 1),
                       (bool)((byte)(*(ulong *)&qualifier->field_0x8 >> 0x1f) & 1),
                       (bool)((byte)(*(ulong *)&qualifier->field_0x8 >> 0x2d) & 1),
                       (bool)((byte)(*(ulong *)&qualifier->field_0x8 >> 0x2c) & 1));
    range_1.start =
         checkLocationRange(this,elementType.spirvType._4_4_,(TIoRange *)local_114,type,
                            typeCollision);
    if (range_1.start < 0) {
      std::vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>::push_back
                (this->usedIo + elementType.spirvType._4_4_,(value_type *)local_114);
      TRange::TRange(&componentRange2,((uint)*(undefined8 *)&qualifier->field_0x1c & 0xfff) + 1,
                     ((uint)*(undefined8 *)&qualifier->field_0x1c & 0xfff) + 1);
      TRange::TRange((TRange *)&range2.centroid,0,1);
      TVar4 = (*type->_vptr_TType[7])();
      TIoRange::TIoRange((TIoRange *)local_154,componentRange2,(TRange)range2._24_8_,TVar4,0,
                         (bool)((byte)(*(ulong *)&qualifier->field_0x8 >> 0x1d) & 1),
                         (bool)((byte)(*(ulong *)&qualifier->field_0x8 >> 0x1e) & 1),
                         (bool)((byte)(*(ulong *)&qualifier->field_0x8 >> 0x1f) & 1),
                         (bool)((byte)(*(ulong *)&qualifier->field_0x8 >> 0x2d) & 1),
                         (bool)((byte)(*(ulong *)&qualifier->field_0x8 >> 0x2c) & 1));
      range_1.start =
           checkLocationRange(this,elementType.spirvType._4_4_,(TIoRange *)local_154,type,
                              typeCollision);
      if (range_1.start < 0) {
        std::vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>::push_back
                  (this->usedIo + elementType.spirvType._4_4_,(value_type *)local_154);
      }
    }
    this_local._4_4_ = range_1.start;
  }
  else {
    TRange::TRange(&componentRange,(uint)*(undefined8 *)&qualifier->field_0x1c & 0xfff,
                   ((uint)*(undefined8 *)&qualifier->field_0x1c & 0xfff) +
                   (int)elementType.spirvType + -1);
    TRange::TRange((TRange *)&basicTy,0,3);
    bVar1 = TQualifier::hasComponent(qualifier);
    if ((bVar1) || (iVar3 = (*type->_vptr_TType[0xc])(), 0 < iVar3)) {
      iVar3 = (*type->_vptr_TType[0xc])();
      iVar5 = (*type->_vptr_TType[7])();
      iVar6 = 1;
      if (iVar5 == 2) {
        iVar6 = 2;
      }
      range._28_4_ = iVar3 * iVar6;
      bVar1 = TQualifier::hasComponent(qualifier);
      if (bVar1) {
        basicTy = (TBasicType)(*(ulong *)&qualifier->field_0x1c >> 0xc) & EbtUint16;
      }
      consumedComponents = basicTy + range._28_4_ + -1;
    }
    range._24_4_ = (*type->_vptr_TType[7])();
    if (range._24_4_ == 0xe) {
      iVar3 = (*type->_vptr_TType[8])();
      bVar1 = TSampler::isAttachmentEXT((TSampler *)CONCAT44(extraout_var,iVar3));
      if (bVar1) {
        iVar3 = (*type->_vptr_TType[8])();
        range._24_4_ = *(uint *)CONCAT44(extraout_var_00,iVar3) & 0xff;
      }
    }
    basicType = range._24_4_;
    component.last = consumedComponents;
    component.start = basicTy;
    bVar1 = TQualifier::hasIndex(qualifier);
    if (bVar1) {
      local_1c4 = TQualifier::getIndex(qualifier);
    }
    else {
      local_1c4 = 0;
    }
    TIoRange::TIoRange((TIoRange *)local_19c,componentRange,component,basicType,local_1c4,
                       (bool)((byte)(*(ulong *)&qualifier->field_0x8 >> 0x1d) & 1),
                       (bool)((byte)(*(ulong *)&qualifier->field_0x8 >> 0x1e) & 1),
                       (bool)((byte)(*(ulong *)&qualifier->field_0x8 >> 0x1f) & 1),
                       (bool)((byte)(*(ulong *)&qualifier->field_0x8 >> 0x2d) & 1),
                       (bool)((byte)(*(ulong *)&qualifier->field_0x8 >> 0x2c) & 1));
    bVar1 = isEsProfile(this);
    if ((((bVar1) || (this->language != EShLangVertex)) ||
        (bVar1 = TQualifier::isPipeInput(qualifier), !bVar1)) || (0 < (this->spvVersion).vulkan)) {
      range_1.start =
           checkLocationRange(this,elementType.spirvType._4_4_,(TIoRange *)local_19c,type,
                              typeCollision);
    }
    if (range_1.start < 0) {
      std::vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>::push_back
                (this->usedIo + elementType.spirvType._4_4_,(value_type *)local_19c);
    }
    this_local._4_4_ = range_1.start;
  }
  return this_local._4_4_;
}

Assistant:

int TIntermediate::addUsedLocation(const TQualifier& qualifier, const TType& type, bool& typeCollision)
{
    typeCollision = false;

    int set;
    if (qualifier.isPipeInput())
        set = 0;
    else if (qualifier.isPipeOutput())
        set = 1;
    else if (qualifier.storage == EvqUniform)
        set = 2;
    else if (qualifier.storage == EvqBuffer)
        set = 3;
    else if (qualifier.storage == EvqTileImageEXT)
        set = 4;
    else if (qualifier.isAnyPayload())
        set = 0;
    else if (qualifier.isAnyCallable())
        set = 1;
    else if (qualifier.isHitObjectAttrNV())
        set = 2;
    else
        return -1;

    int size;
    if (qualifier.isAnyPayload() || qualifier.isAnyCallable()) {
        size = 1;
    } else if (qualifier.isUniformOrBuffer() || qualifier.isTaskMemory()) {
        if (type.isSizedArray())
            size = type.getCumulativeArraySize();
        else
            size = 1;
    } else {
        // Strip off the outer array dimension for those having an extra one.
        if (type.isArray() && qualifier.isArrayedIo(language)) {
            TType elementType(type, 0);
            size = computeTypeLocationSize(elementType, language);
        } else
            size = computeTypeLocationSize(type, language);
    }

    // Locations, and components within locations.
    //
    // Almost always, dealing with components means a single location is involved.
    // The exception is a dvec3. From the spec:
    //
    // "A dvec3 will consume all four components of the first location and components 0 and 1 of
    // the second location. This leaves components 2 and 3 available for other component-qualified
    // declarations."
    //
    // That means, without ever mentioning a component, a component range
    // for a different location gets specified, if it's not a vertex shader input. (!)
    // (A vertex shader input will show using only one location, even for a dvec3/4.)
    //
    // So, for the case of dvec3, we need two independent ioRanges.
    //
    // For raytracing IO (payloads and callabledata) each declaration occupies a single
    // slot irrespective of type.
    int collision = -1; // no collision
    if (qualifier.isAnyPayload() || qualifier.isAnyCallable() || qualifier.isHitObjectAttrNV()) {
        TRange range(qualifier.layoutLocation, qualifier.layoutLocation);
        collision = checkLocationRT(set, qualifier.layoutLocation);
        if (collision < 0)
            usedIoRT[set].push_back(range);
        return collision;
    }
    if (size == 2 && type.getBasicType() == EbtDouble && type.getVectorSize() == 3 &&
        (qualifier.isPipeInput() || qualifier.isPipeOutput())) {
        // Dealing with dvec3 in/out split across two locations.
        // Need two io-ranges.
        // The case where the dvec3 doesn't start at component 0 was previously caught as overflow.

        // First range:
        TRange locationRange(qualifier.layoutLocation, qualifier.layoutLocation);
        TRange componentRange(0, 3);
        TIoRange range(locationRange, componentRange, type.getBasicType(), 0, qualifier.centroid, qualifier.smooth, qualifier.flat, qualifier.sample, qualifier.patch);

        // check for collisions
        collision = checkLocationRange(set, range, type, typeCollision);
        if (collision < 0) {
            usedIo[set].push_back(range);

            // Second range:
            TRange locationRange2(qualifier.layoutLocation + 1, qualifier.layoutLocation + 1);
            TRange componentRange2(0, 1);
            TIoRange range2(locationRange2, componentRange2, type.getBasicType(), 0, qualifier.centroid, qualifier.smooth, qualifier.flat, qualifier.sample, qualifier.patch);

            // check for collisions
            collision = checkLocationRange(set, range2, type, typeCollision);
            if (collision < 0)
                usedIo[set].push_back(range2);
        }
        return collision;
    }

    // Not a dvec3 in/out split across two locations, generic path.
    // Need a single IO-range block.

    TRange locationRange(qualifier.layoutLocation, qualifier.layoutLocation + size - 1);
    TRange componentRange(0, 3);
    if (qualifier.hasComponent() || type.getVectorSize() > 0) {
        int consumedComponents = type.getVectorSize() * (type.getBasicType() == EbtDouble ? 2 : 1);
        if (qualifier.hasComponent())
            componentRange.start = qualifier.layoutComponent;
        componentRange.last  = componentRange.start + consumedComponents - 1;
    }

    // combine location and component ranges
    TBasicType basicTy = type.getBasicType();
    if (basicTy == EbtSampler && type.getSampler().isAttachmentEXT())
        basicTy = type.getSampler().type;
    TIoRange range(locationRange, componentRange, basicTy, qualifier.hasIndex() ? qualifier.getIndex() : 0, qualifier.centroid, qualifier.smooth, qualifier.flat, qualifier.sample, qualifier.patch);

    // check for collisions, except for vertex inputs on desktop targeting OpenGL
    if (! (!isEsProfile() && language == EShLangVertex && qualifier.isPipeInput()) || spvVersion.vulkan > 0)
        collision = checkLocationRange(set, range, type, typeCollision);

    if (collision < 0)
        usedIo[set].push_back(range);

    return collision;
}